

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_3dPoint::Transform(ON_3dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_38;
  double ww;
  double zz;
  double yy;
  double xx;
  ON_Xform *xform_local;
  ON_3dPoint *this_local;
  
  local_38 = xform->m_xform[3][2] * this->z +
             xform->m_xform[3][0] * this->x + xform->m_xform[3][1] * this->y + xform->m_xform[3][3];
  if ((local_38 != 0.0) || (NAN(local_38))) {
    local_38 = 1.0 / local_38;
  }
  dVar1 = xform->m_xform[1][0];
  dVar2 = this->x;
  dVar3 = xform->m_xform[1][1];
  dVar4 = xform->m_xform[1][2];
  dVar5 = xform->m_xform[1][3];
  dVar6 = xform->m_xform[2][0];
  dVar7 = this->x;
  dVar8 = xform->m_xform[2][1];
  dVar9 = this->y;
  dVar10 = xform->m_xform[2][2];
  dVar11 = xform->m_xform[2][3];
  this->x = local_38 *
            (xform->m_xform[0][2] * this->z +
             xform->m_xform[0][0] * this->x + xform->m_xform[0][1] * this->y + xform->m_xform[0][3])
  ;
  this->y = local_38 * (dVar4 * this->z + dVar1 * dVar2 + dVar3 * this->y + dVar5);
  this->z = local_38 * (dVar10 * this->z + dVar6 * dVar7 + dVar8 * dVar9 + dVar11);
  return;
}

Assistant:

void ON_3dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,zz,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z + xform.m_xform[1][3]);
  zz = ww*(xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z + xform.m_xform[2][3]);
  x = xx;
  y = yy;
  z = zz;
}